

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timBox.c
# Opt level: O3

int Tim_ManBoxFindFromCiNum(Tim_Man_t *p,int iCiNum)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  if ((-1 < iCiNum) && (iVar1 = Tim_ManCiNum(p), iCiNum < iVar1)) {
    iVar1 = Tim_ManPiNum(p);
    iVar3 = -1;
    if ((iVar1 <= iCiNum) && (iVar3 = -2, 0 < p->vBoxes->nSize)) {
      iVar1 = -1;
      do {
        iVar2 = Tim_ManBoxOutputFirst(p,iVar1 + 1);
        if (iCiNum < iVar2) {
          return iVar1;
        }
        iVar2 = iVar1 + 2;
        iVar1 = iVar1 + 1;
      } while (iVar2 < p->vBoxes->nSize);
    }
    return iVar3;
  }
  __assert_fail("iCiNum >= 0 && iCiNum < Tim_ManCiNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/tim/timBox.c"
                ,0x137,"int Tim_ManBoxFindFromCiNum(Tim_Man_t *, int)");
}

Assistant:

int Tim_ManBoxFindFromCiNum( Tim_Man_t * p, int iCiNum )
{
    Tim_Box_t * pBox;
    int i;
    assert( iCiNum >= 0 && iCiNum < Tim_ManCiNum(p) );
    if ( iCiNum < Tim_ManPiNum(p) )
        return -1;
    Tim_ManForEachBox( p, pBox, i )
        if ( iCiNum < Tim_ManBoxOutputFirst(p, i) )
            return i - 1;
    return -2;
}